

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadFunctionBody(BinaryReader *this,Offset end_offset)

{
  Result RVar1;
  char *format;
  Opcode final_opcode;
  Opcode local_14;
  
  local_14.enum_ = Invalid;
  RVar1 = ReadInstructions(this,false,end_offset,&local_14);
  if (RVar1.enum_ != Error) {
    if ((this->state_).offset == end_offset) {
      if (local_14.enum_ == End) {
        return (Result)Ok;
      }
      format = "function body must end with END opcode";
    }
    else {
      format = "function body longer than given size";
    }
    PrintError(this,format);
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadFunctionBody(Offset end_offset) {
  Opcode final_opcode(Opcode::Invalid);
  CHECK_RESULT(
      ReadInstructions(/*stop_on_end=*/false, end_offset, &final_opcode));
  ERROR_UNLESS(state_.offset == end_offset,
               "function body longer than given size");
  ERROR_UNLESS(final_opcode == Opcode::End,
               "function body must end with END opcode");
  return Result::Ok;
}